

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeSerialGet(uchar *buf,u32 serial_type,Mem *pMem)

{
  ulong *in_RDX;
  uint in_ESI;
  char *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  switch((Mem *)(ulong)in_ESI) {
  case (Mem *)0x0:
  case (Mem *)0xb:
    *(undefined2 *)((long)in_RDX + 0x14) = 1;
    break;
  case (Mem *)0x1:
    *in_RDX = (long)*in_RDI;
    *(undefined2 *)((long)in_RDX + 0x14) = 4;
    break;
  case (Mem *)0x2:
    *in_RDX = (long)(int)CONCAT11(*in_RDI,in_RDI[1]);
    *(undefined2 *)((long)in_RDX + 0x14) = 4;
    break;
  case (Mem *)0x3:
    *in_RDX = (long)(int)((int)*in_RDI << 0x10 | (uint)(byte)in_RDI[1] << 8 | (uint)(byte)in_RDI[2])
    ;
    *(undefined2 *)((long)in_RDX + 0x14) = 4;
    break;
  case (Mem *)0x4:
    *in_RDX = (long)(int)((int)*in_RDI << 0x18 | (uint)(byte)in_RDI[1] << 0x10 |
                          (uint)(byte)in_RDI[2] << 8 | (uint)(byte)in_RDI[3]);
    *(undefined2 *)((long)in_RDX + 0x14) = 4;
    break;
  case (Mem *)0x5:
    *in_RDX = CONCAT44((int)CONCAT11(*in_RDI,in_RDI[1]),
                       (uint)(byte)in_RDI[2] << 0x18 | (uint)(byte)in_RDI[3] << 0x10 |
                       (uint)(byte)in_RDI[4] << 8 | (uint)(byte)in_RDI[5]);
    *(undefined2 *)((long)in_RDX + 0x14) = 4;
    break;
  case (Mem *)0x6:
  case (Mem *)0x7:
    serialGet((uchar *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(u32)((ulong)in_RDX >> 0x20),
              (Mem *)(ulong)in_ESI);
    break;
  case (Mem *)0x8:
  case (Mem *)0x9:
    *in_RDX = (ulong)(in_ESI - 8);
    *(undefined2 *)((long)in_RDX + 0x14) = 4;
    break;
  case (Mem *)0xa:
    *(undefined2 *)((long)in_RDX + 0x14) = 0x401;
    *(undefined4 *)(in_RDX + 2) = 0;
    *(undefined4 *)in_RDX = 0;
    break;
  default:
    in_RDX[1] = (ulong)in_RDI;
    *(uint *)(in_RDX + 2) = in_ESI - 0xc >> 1;
    *(u16 *)((long)in_RDX + 0x14) = sqlite3VdbeSerialGet::aFlag[in_ESI & 1];
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeSerialGet(
  const unsigned char *buf,     /* Buffer to deserialize from */
  u32 serial_type,              /* Serial type to deserialize */
  Mem *pMem                     /* Memory cell to write value into */
){
  switch( serial_type ){
    case 10: { /* Internal use only: NULL with virtual table
               ** UPDATE no-change flag set */
      pMem->flags = MEM_Null|MEM_Zero;
      pMem->n = 0;
      pMem->u.nZero = 0;
      return;
    }
    case 11:   /* Reserved for future use */
    case 0: {  /* Null */
      /* EVIDENCE-OF: R-24078-09375 Value is a NULL. */
      pMem->flags = MEM_Null;
      return;
    }
    case 1: {
      /* EVIDENCE-OF: R-44885-25196 Value is an 8-bit twos-complement
      ** integer. */
      pMem->u.i = ONE_BYTE_INT(buf);
      pMem->flags = MEM_Int;
      testcase( pMem->u.i<0 );
      return;
    }
    case 2: { /* 2-byte signed integer */
      /* EVIDENCE-OF: R-49794-35026 Value is a big-endian 16-bit
      ** twos-complement integer. */
      pMem->u.i = TWO_BYTE_INT(buf);
      pMem->flags = MEM_Int;
      testcase( pMem->u.i<0 );
      return;
    }
    case 3: { /* 3-byte signed integer */
      /* EVIDENCE-OF: R-37839-54301 Value is a big-endian 24-bit
      ** twos-complement integer. */
      pMem->u.i = THREE_BYTE_INT(buf);
      pMem->flags = MEM_Int;
      testcase( pMem->u.i<0 );
      return;
    }
    case 4: { /* 4-byte signed integer */
      /* EVIDENCE-OF: R-01849-26079 Value is a big-endian 32-bit
      ** twos-complement integer. */
      pMem->u.i = FOUR_BYTE_INT(buf);
#ifdef __HP_cc
      /* Work around a sign-extension bug in the HP compiler for HP/UX */
      if( buf[0]&0x80 ) pMem->u.i |= 0xffffffff80000000LL;
#endif
      pMem->flags = MEM_Int;
      testcase( pMem->u.i<0 );
      return;
    }
    case 5: { /* 6-byte signed integer */
      /* EVIDENCE-OF: R-50385-09674 Value is a big-endian 48-bit
      ** twos-complement integer. */
      pMem->u.i = FOUR_BYTE_UINT(buf+2) + (((i64)1)<<32)*TWO_BYTE_INT(buf);
      pMem->flags = MEM_Int;
      testcase( pMem->u.i<0 );
      return;
    }
    case 6:   /* 8-byte signed integer */
    case 7: { /* IEEE floating point */
      /* These use local variables, so do them in a separate routine
      ** to avoid having to move the frame pointer in the common case */
      serialGet(buf,serial_type,pMem);
      return;
    }
    case 8:    /* Integer 0 */
    case 9: {  /* Integer 1 */
      /* EVIDENCE-OF: R-12976-22893 Value is the integer 0. */
      /* EVIDENCE-OF: R-18143-12121 Value is the integer 1. */
      pMem->u.i = serial_type-8;
      pMem->flags = MEM_Int;
      return;
    }
    default: {
      /* EVIDENCE-OF: R-14606-31564 Value is a BLOB that is (N-12)/2 bytes in
      ** length.
      ** EVIDENCE-OF: R-28401-00140 Value is a string in the text encoding and
      ** (N-13)/2 bytes in length. */
      static const u16 aFlag[] = { MEM_Blob|MEM_Ephem, MEM_Str|MEM_Ephem };
      pMem->z = (char *)buf;
      pMem->n = (serial_type-12)/2;
      pMem->flags = aFlag[serial_type&1];
      return;
    }
  }
  return;
}